

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O3

Color __thiscall RoughConductorBRDF::f(RoughConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar6;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  Color CVar34;
  float local_58;
  float fStack_54;
  
  fVar28 = PI;
  fVar15 = wo->z;
  fVar33 = wi->z;
  fVar27 = fVar15 + fVar33;
  uVar3 = wo->x;
  uVar7 = wo->y;
  uVar4 = wi->x;
  uVar8 = wi->y;
  fVar12 = (float)uVar3 + (float)uVar4;
  fVar18 = (float)uVar7 + (float)uVar8;
  fVar32 = 1.0 / SQRT(fVar27 * fVar27 + fVar12 * fVar12 + fVar18 * fVar18);
  fVar27 = fVar27 * fVar32;
  fVar12 = fVar32 * fVar12;
  fVar32 = fVar32 * fVar18;
  fVar18 = -fVar27;
  local_58 = fVar12;
  fStack_54 = fVar32;
  if (fVar27 < fVar18) {
    local_58 = -fVar12;
    fStack_54 = -fVar32;
  }
  fVar31 = *(float *)&(this->super_BRDF).field_0x10;
  fVar10 = *(float *)&(this->super_BRDF).field_0x8;
  fVar11 = *(float *)&(this->super_BRDF).field_0xc;
  uVar6 = *(undefined8 *)&(this->super_BRDF).field_0x14;
  fVar29 = (float)uVar6;
  fVar30 = (float)((ulong)uVar6 >> 0x20);
  fVar1 = *(float *)&this->field_0x1c;
  fVar2 = this->alpha;
  fVar13 = fVar18;
  if (fVar18 <= fVar27) {
    fVar13 = fVar27;
  }
  fVar14 = 1.0 - fVar15 * fVar15;
  fVar20 = 1.0;
  if (0.0 < fVar14) {
    if (fVar14 < 0.0) {
      fVar14 = sqrtf(fVar14);
    }
    else {
      fVar14 = SQRT(fVar14);
    }
    fVar14 = fVar14 / fVar15;
    fVar20 = 1.0;
    if (((fVar14 != 0.0) || (NAN(fVar14))) &&
       (fVar20 = 0.0,
       0.0 < (fVar15 * fVar13 + (float)uVar3 * local_58 + fStack_54 * (float)uVar7) * fVar15)) {
      fVar20 = 2.0 / (SQRT(ABS(fVar14) * fVar2 * ABS(fVar14) * fVar2 + 1.0) + 1.0);
    }
  }
  fVar19 = 1.0;
  fVar14 = 1.0 - fVar33 * fVar33;
  if (0.0 < fVar14) {
    if (fVar14 < 0.0) {
      fVar14 = sqrtf(fVar14);
    }
    else {
      fVar14 = SQRT(fVar14);
    }
    fVar19 = 1.0;
    fVar14 = fVar14 / fVar33;
    if (((fVar14 != 0.0) || (NAN(fVar14))) &&
       (fVar19 = 0.0,
       0.0 < (fVar13 * fVar33 + (float)uVar4 * local_58 + fStack_54 * (float)uVar8) * fVar33)) {
      fVar19 = 2.0 / (SQRT(ABS(fVar14) * fVar2 * ABS(fVar14) * fVar2 + 1.0) + 1.0);
    }
  }
  fVar33 = fVar18 * fVar27 + 1.0;
  auVar16._0_4_ = (undefined4)DAT_00157120;
  auVar16._4_4_ = fVar2;
  auVar16._8_4_ = DAT_00157120._4_4_;
  auVar16._12_4_ = 0;
  auVar24._4_4_ =
       (fVar2 * fVar2 + (float)(-(uint)(0.0 < fVar33) & (uint)(fVar33 / (fVar27 * fVar27)))) *
       fVar27 * fVar27;
  auVar24._0_4_ = fVar28;
  auVar24._8_8_ = 0;
  auVar17 = divps(auVar16,auVar24);
  fVar28 = fVar15 * fVar27 + fVar12 * (float)uVar3 + (float)uVar7 * fVar32;
  fVar15 = fVar28 * fVar28;
  fVar33 = (fVar31 + fVar31) * fVar28;
  fVar12 = fVar1 * fVar1 + fVar31 * fVar31;
  auVar21._0_4_ = (fVar12 - fVar33) + fVar15;
  auVar21._4_4_ = (fVar12 * fVar15 - fVar33) + 1.0;
  auVar21._8_4_ = (0.0 - fVar33) + 0.0;
  auVar21._12_4_ = (0.0 - fVar33) + 0.0;
  auVar22._4_4_ = fVar33 + fVar12 * fVar15 + 1.0;
  auVar22._0_4_ = fVar33 + fVar12 + fVar15;
  auVar22._8_4_ = fVar33 + 0.0 + 0.0;
  auVar22._12_4_ = fVar33 + 0.0 + 0.0;
  auVar22 = divps(auVar21,auVar22);
  fVar32 = fVar29 * fVar29 + fVar10 * fVar10;
  fVar31 = fVar30 * fVar30 + fVar11 * fVar11;
  fVar33 = (auVar17._4_4_ * auVar17._4_4_ * auVar17._0_4_ * fVar20 * fVar19) / (wo->z * 4.0 * wi->z)
  ;
  fVar12 = fVar28 * (fVar10 + fVar10);
  fVar18 = fVar28 * (fVar11 + fVar11);
  fVar27 = fVar28 * 0.0;
  fVar28 = fVar28 * 0.0;
  auVar23._0_4_ = (fVar32 * fVar15 - fVar12) + 1.0;
  auVar23._4_4_ = (fVar31 * fVar15 - fVar18) + 1.0;
  auVar23._8_4_ = (fVar15 * 0.0 - fVar27) + 0.0;
  auVar23._12_4_ = (fVar15 * 0.0 - fVar28) + 0.0;
  auVar25._0_4_ = fVar12 + fVar32 * fVar15 + 1.0;
  auVar25._4_4_ = fVar18 + fVar31 * fVar15 + 1.0;
  auVar25._8_4_ = fVar27 + fVar15 * 0.0 + 0.0;
  auVar25._12_4_ = fVar28 + fVar15 * 0.0 + 0.0;
  auVar24 = divps(auVar23,auVar25);
  auVar26._0_4_ = (fVar32 - fVar12) + fVar15;
  auVar26._4_4_ = (fVar31 - fVar18) + fVar15;
  auVar26._8_4_ = (0.0 - fVar27) + fVar15;
  auVar26._12_4_ = (0.0 - fVar28) + fVar15;
  auVar17._4_4_ = fVar18 + fVar31 + fVar15;
  auVar17._0_4_ = fVar12 + fVar32 + fVar15;
  auVar17._8_4_ = fVar27 + 0.0 + fVar15;
  auVar17._12_4_ = fVar28 + 0.0 + fVar15;
  auVar17 = divps(auVar26,auVar17);
  uVar5 = albedo->x;
  uVar9 = albedo->y;
  CVar34.x = (float)uVar5 * fVar33 * (auVar17._0_4_ + auVar24._0_4_) * 0.5;
  CVar34.y = (float)uVar9 * fVar33 * (auVar17._4_4_ + auVar24._4_4_) * 0.5;
  CVar34.z = (auVar22._4_4_ + auVar22._0_4_) * 0.5 * fVar33 * albedo->z;
  return CVar34;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const override
	{
		vec3f wm = normalized(wo+wi); // microfacet normal
		float cos = dot(wm,wo);
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		Color Fres = 0.5 * (r1 + r2); // reflected energy
		return EDX::GGX_D(wm,alpha) * EDX::Smith_G(wo,wi,wm,alpha) / (4 * wo.z * wi.z) * Fres * albedo;
	}